

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashFunction.h
# Opt level: O1

void __thiscall bwtil::HashFunction::quickSort(HashFunction *this,ulint *arr,uint n)

{
  ulong uVar1;
  ulint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  do {
    if (n < 2) {
      return;
    }
    uVar6 = (ulong)n;
    uVar3 = rand();
    uVar1 = arr[(ulong)uVar3 % uVar6];
    uVar4 = 0;
    do {
      uVar5 = uVar4;
      if (uVar1 <= arr[uVar4]) break;
      uVar4 = uVar4 + 1;
      uVar5 = uVar6;
    } while (uVar6 != uVar4);
    if ((uint)uVar5 < n) {
      uVar4 = uVar5 & 0xffffffff;
      do {
        uVar5 = uVar5 & 0xffffffff;
        do {
          if (arr[uVar5] < uVar1) {
            uVar2 = arr[uVar4];
            arr[uVar4] = arr[uVar5];
            arr[uVar5] = uVar2;
            uVar4 = (ulong)((int)uVar4 + 1);
            break;
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 < uVar6);
      } while ((uint)uVar5 < n);
    }
    else {
      uVar4 = uVar5 & 0xffffffff;
    }
    if ((int)uVar4 == 0) {
      uVar4 = 0;
      do {
        uVar6 = uVar4;
        uVar4 = (ulong)((int)uVar6 + 1);
      } while (arr[uVar6] != uVar1);
      uVar2 = *arr;
      *arr = arr[uVar6];
      arr[uVar6] = uVar2;
      uVar4 = 1;
    }
    quickSort(this,arr,(uint)uVar4);
    arr = arr + uVar4;
    n = n - (uint)uVar4;
  } while( true );
}

Assistant:

void quickSort(ulint *arr, uint n) {

		if(n<2) return;

		ulint pivot = arr[rand()%(n)];
		ulint t;
		uint i=0,j=0;

		while(i<n && arr[i]<pivot)
			i++;

		j=i;

		//invariant: arr[0,...,i-1]<pivot; arr[i,...,j]>=pivot
		while (j<n) {

			while(j<n && (arr[j]>=pivot))
				j++;

			if(j<n){//swap arr[i] and arr[j]
				t = arr[i];
				arr[i] = arr[j];
				arr[j] = t;
				i++;
			}

		}

		if(i==0){//pivot is the minimum element: avoid loop

			j=0;
			while(arr[j]!=pivot)
				j++;

			t = arr[i];
			arr[i] = arr[j];
			arr[j] = t;

			i++;
		}

		quickSort(arr,i);
		quickSort(arr+i,n-i);

	}